

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

float Lf_CutRef_rec(Lf_Man_t *p,Lf_Cut_t *pCut)

{
  int iVar1;
  Lf_Cut_t *pCut_00;
  bool bVar2;
  float fVar3;
  int local_74;
  int local_70;
  int Var;
  int i;
  float Count;
  word CutTemp [10];
  Lf_Cut_t *pCut_local;
  Lf_Man_t *p_local;
  
  CutTemp[9] = (word)pCut;
  memset(&i,0,0x50);
  Var = (int)Lf_CutArea(p,(Lf_Cut_t *)CutTemp[9]);
  local_70 = 0;
  while( true ) {
    bVar2 = false;
    if (local_70 < (int)(*(uint *)(CutTemp[9] + 0x14) >> 0x18)) {
      local_74 = *(int *)(CutTemp[9] + 0x18 + (long)local_70 * 4);
      bVar2 = local_74 != 0;
    }
    if (!bVar2) break;
    iVar1 = Lf_ObjOff(p,local_74);
    if ((-1 < iVar1) && (iVar1 = Lf_ObjMapRefInc(p,local_74), iVar1 == 0)) {
      pCut_00 = Lf_ObjCutBestNew(p,local_74,(Lf_Cut_t *)&i);
      fVar3 = Lf_CutRef_rec(p,pCut_00);
      Var = (int)(fVar3 + (float)Var);
    }
    local_70 = local_70 + 1;
  }
  return (float)Var;
}

Assistant:

float Lf_CutRef_rec( Lf_Man_t * p, Lf_Cut_t * pCut )
{
    word CutTemp[LF_CUT_WORDS] = {0};
    float Count = Lf_CutArea(p, pCut);
    int i, Var; 
    Lf_CutForEachVar( pCut, Var, i )
        if ( !Lf_ObjMapRefInc(p, Var) )
            Count += Lf_CutRef_rec( p, Lf_ObjCutBestNew(p, Var, (Lf_Cut_t *)CutTemp) );
    return Count;
}